

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O2

void __thiscall RTIMUMagCal::magCalSaveMinMax(RTIMUMagCal *this)

{
  RTIMUSettings *pRVar1;
  long lVar2;
  
  pRVar1 = this->m_settings;
  pRVar1->m_compassCalValid = true;
  RTVector3::operator=(&pRVar1->m_compassCalMin,&this->m_magMin);
  RTVector3::operator=(&this->m_settings->m_compassCalMax,&this->m_magMax);
  pRVar1 = this->m_settings;
  pRVar1->m_compassCalEllipsoidValid = false;
  (*(pRVar1->super_RTIMUHal)._vptr_RTIMUHal[3])();
  this->m_magCalCount = 0;
  for (lVar2 = 0xea74; lVar2 != 0xea7c; lVar2 = lVar2 + 1) {
    (this->m_magMin).m_data[lVar2 + -2] = 0.0;
  }
  this->m_magCalInIndex = 0;
  this->m_magCalOutIndex = 0;
  setMinMaxCal(this);
  return;
}

Assistant:

void RTIMUMagCal::magCalSaveMinMax()
{
    m_settings->m_compassCalValid = true;
    m_settings->m_compassCalMin = m_magMin;
    m_settings->m_compassCalMax = m_magMax;
    m_settings->m_compassCalEllipsoidValid = false;
    m_settings->saveSettings();

    //  need to invalidate ellipsoid data in order to use new min/max data

    m_magCalCount = 0;
    for (int i = 0; i < RTIMUCALDEFS_OCTANT_COUNT; i++)
        m_octantCounts[i] = 0;
    m_magCalInIndex = m_magCalOutIndex = 0;

    // and set up for min/max calibration

    setMinMaxCal();
}